

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O0

bool __thiscall cmCTestP4::DiffParser::ProcessLine(DiffParser *this)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  string local_30;
  DiffParser *local_10;
  DiffParser *this_local;
  
  local_10 = this;
  uVar2 = std::__cxx11::string::empty();
  if ((((uVar2 & 1) == 0) &&
      (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&(this->super_LineParser).Line),
      *pcVar3 == '=')) &&
     (bVar1 = cmsys::RegularExpression::find(&this->RegexDiff,&(this->super_LineParser).Line), bVar1
     )) {
    cmsys::RegularExpression::match_abi_cxx11_(&local_30,&this->RegexDiff,1);
    std::__cxx11::string::operator=((string *)&this->CurrentPath,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    this->AlreadyNotified = false;
  }
  else if ((this->AlreadyNotified & 1U) == 0) {
    (*(this->P4->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC[10])
              (this->P4,1,&this->CurrentPath);
    this->AlreadyNotified = true;
  }
  return true;
}

Assistant:

bool ProcessLine() override
  {
    if (!this->Line.empty() && this->Line[0] == '=' &&
        this->RegexDiff.find(this->Line)) {
      this->CurrentPath = this->RegexDiff.match(1);
      this->AlreadyNotified = false;
    } else {
      if (!this->AlreadyNotified) {
        this->P4->DoModification(PathModified, this->CurrentPath);
        this->AlreadyNotified = true;
      }
    }
    return true;
  }